

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

Config * Config::load(Config *__return_storage_ptr__,string *file)

{
  string *this;
  double dVar1;
  double dVar2;
  double dVar3;
  _Head_base<1UL,_float,_false> _Var4;
  float fVar5;
  bool bVar6;
  pointer piVar7;
  pointer pVVar8;
  GradientInterpolationType GVar9;
  int iVar10;
  uint uVar11;
  Value *this_00;
  size_t sVar12;
  Value *pVVar13;
  Value *pVVar14;
  return_type pbVar15;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *p_Var16;
  long lVar17;
  mapped_type *this_01;
  _Base_ptr p_Var18;
  return_type __x;
  Value *this_02;
  Value *this_03;
  Value *this_04;
  Value *this_05;
  Value *this_06;
  Value *this_07;
  char *pcVar19;
  mapped_type *this_08;
  runtime_error *prVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  pointer piVar21;
  ulong index;
  Value *this_09;
  _Rb_tree_header *p_Var22;
  pointer this_10;
  float b;
  float g;
  float r;
  Value *local_4e0;
  string channel;
  uint ti;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  trs;
  tuple<float,_float,_float> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  Gradient grad;
  return_type vs;
  uint auStack_3c0 [90];
  vector<toml::Value,_std::allocator<toml::Value>_> points;
  ParseResult pr;
  Handler h;
  
  Config(__return_storage_ptr__);
  toml::parseFile(&pr,file);
  if (pr.value.type_ == NULL_TYPE) {
    __return_storage_ptr__->ok = false;
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->error);
  }
  else {
    std::__cxx11::string::string((string *)&h,"handler",(allocator *)&vs);
    this_00 = toml::Value::find(&pr.value,&h.type);
    std::__cxx11::string::~string((string *)&h);
    if ((this_00 == (Value *)0x0) || (sVar12 = toml::Value::size(this_00), sVar12 == 0)) {
      __return_storage_ptr__->ok = false;
      std::__cxx11::string::assign((char *)&__return_storage_ptr__->error);
    }
    else {
      this = &__return_storage_ptr__->error;
      index = 0;
      do {
        p_Var22 = &trs._M_t._M_impl.super__Rb_tree_header;
        sVar12 = toml::Value::size(this_00);
        if (sVar12 <= index) break;
        pVVar13 = toml::Value::find(this_00,index);
        Handler::Handler(&h);
        std::__cxx11::string::string((string *)&vs,"type",(allocator *)&trs);
        toml::Value::get<std::__cxx11::string>(pVVar13,(string *)&vs);
        std::__cxx11::string::_M_assign((string *)&h);
        std::__cxx11::string::~string((string *)&vs);
        std::__cxx11::string::string((string *)&vs,"product",(allocator *)&trs);
        pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
        std::__cxx11::string::~string((string *)&vs);
        if (pVVar14 != (Value *)0x0) {
          toml::Value::as<std::__cxx11::string>(pVVar14);
          std::__cxx11::string::_M_assign((string *)&h.origin);
        }
        std::__cxx11::string::string((string *)&vs,"origin",(allocator *)&trs);
        pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
        std::__cxx11::string::~string((string *)&vs);
        if (pVVar14 == (Value *)0x0) {
LAB_0016785a:
          std::__cxx11::string::string((string *)&vs,"products",(allocator *)&trs);
          pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
          std::__cxx11::string::~string((string *)&vs);
          if (pVVar14 != (Value *)0x0) {
            toml::Value::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((return_type *)&vs,pVVar14);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&h.products,(string *)&vs);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&vs);
          }
          std::__cxx11::string::string((string *)&vs,"region",(allocator *)&trs);
          pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
          std::__cxx11::string::~string((string *)&vs);
          if (pVVar14 != (Value *)0x0) {
            pbVar15 = toml::Value::as<std::__cxx11::string>(pVVar14);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&h.regions,pbVar15);
          }
          std::__cxx11::string::string((string *)&vs,"regions",(allocator *)&trs);
          pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
          std::__cxx11::string::~string((string *)&vs);
          if (pVVar14 != (Value *)0x0) {
            toml::Value::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((return_type *)&vs,pVVar14);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&h.regions,(string *)&vs);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&vs);
          }
          std::__cxx11::string::string((string *)&vs,"channels",(allocator *)&trs);
          pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
          std::__cxx11::string::~string((string *)&vs);
          if (pVVar14 != (Value *)0x0) {
            toml::Value::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((return_type *)&vs,pVVar14);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&h.channels,(string *)&vs);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&vs);
          }
          std::__cxx11::string::string((string *)&vs,"dir",(allocator *)&trs);
          pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
          std::__cxx11::string::~string((string *)&vs);
          if (pVVar14 == (Value *)0x0) {
            std::__cxx11::string::string((string *)&vs,"directory",(allocator *)&trs);
            pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
            std::__cxx11::string::~string((string *)&vs);
            if (pVVar14 != (Value *)0x0) goto LAB_00167a0f;
            std::__cxx11::string::assign((char *)&h.dir);
          }
          else {
LAB_00167a0f:
            toml::Value::as<std::__cxx11::string>(pVVar14);
            std::__cxx11::string::_M_assign((string *)&h.dir);
          }
          std::__cxx11::string::string((string *)&vs,"format",(allocator *)&trs);
          pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
          std::__cxx11::string::~string((string *)&vs);
          if (pVVar14 == (Value *)0x0) {
            std::__cxx11::string::assign((char *)&h.format);
          }
          else {
            toml::Value::as<std::__cxx11::string>(pVVar14);
            std::__cxx11::string::_M_assign((string *)&h.format);
          }
          std::__cxx11::string::string((string *)&vs,"json",(allocator *)&trs);
          pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
          std::__cxx11::string::~string((string *)&vs);
          if (pVVar14 != (Value *)0x0) {
            h.json = toml::Value::as<bool>(pVVar14);
          }
          std::__cxx11::string::string((string *)&vs,"crop",(allocator *)&trs);
          pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
          std::__cxx11::string::~string((string *)&vs);
          if (pVVar14 == (Value *)0x0) {
LAB_00167b94:
            std::__cxx11::string::string((string *)&vs,"remap",(allocator *)&trs);
            pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
            std::__cxx11::string::~string((string *)&vs);
            if (pVVar14 != (Value *)0x0) {
              p_Var16 = &toml::Value::
                         as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                                   (pVVar14)->_M_t;
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::_Rb_tree(&trs._M_t,p_Var16);
              for (p_Var18 = trs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var18 != p_Var22;
                  p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
                util::toUpper(&channel,(string *)(p_Var18 + 1));
                std::__cxx11::string::string((string *)&vs,"path",(allocator *)&grad);
                pbVar15 = toml::Value::get<std::__cxx11::string>
                                    ((Value *)(p_Var18 + 2),(string *)&vs);
                std::__cxx11::string::string((string *)&path,(string *)pbVar15);
                std::__cxx11::string::~string((string *)&vs);
                cv::imread((string *)&vs,(int)&path);
                if (vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_end_of_storage == (pointer)0x0) {
                  __return_storage_ptr__->ok = false;
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&grad,"Unable to load image at: ",&path);
                  std::__cxx11::string::operator=((string *)this,(string *)&grad);
                  std::__cxx11::string::~string((string *)&grad);
LAB_00167d96:
                  cv::Mat::~Mat((Mat *)&vs);
                  std::__cxx11::string::~string((string *)&path);
                  std::__cxx11::string::~string((string *)&channel);
                  bVar6 = true;
                  goto LAB_00167dbd;
                }
                lVar17 = cv::Mat::total();
                if (lVar17 != 0x100) {
                  __return_storage_ptr__->ok = false;
                  std::__cxx11::string::assign((char *)this);
                  goto LAB_00167d96;
                }
                this_01 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>_>
                          ::operator[](&h.remap,&channel);
                cv::Mat::operator=(this_01,(Mat *)&vs);
                cv::Mat::~Mat((Mat *)&vs);
                std::__cxx11::string::~string((string *)&path);
                std::__cxx11::string::~string((string *)&channel);
              }
              bVar6 = false;
LAB_00167dbd:
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::~_Rb_tree(&trs._M_t);
              if ((_Rb_tree_header *)p_Var18 != p_Var22) goto LAB_00167cf5;
            }
            std::__cxx11::string::string((string *)&vs,"gradient",(allocator *)&trs);
            pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
            std::__cxx11::string::~string((string *)&vs);
            if (pVVar14 != (Value *)0x0) {
              p_Var16 = &toml::Value::
                         as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                                   (pVVar14)->_M_t;
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::_Rb_tree(&trs._M_t,p_Var16);
              for (p_Var18 = trs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var18 != &trs._M_t._M_impl.super__Rb_tree_header;
                  p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
                util::toUpper(&path,(string *)(p_Var18 + 1));
                std::__cxx11::string::string((string *)&vs,"interpolation",(allocator *)&channel);
                pVVar14 = toml::Value::find((Value *)(p_Var18 + 2),(string *)&vs);
                std::__cxx11::string::~string((string *)&vs);
                GVar9 = h.lerptype;
                if (pVVar14 != (Value *)0x0) {
                  pbVar15 = toml::Value::as<std::__cxx11::string>(pVVar14);
                  iVar10 = std::__cxx11::string::compare((char *)pbVar15);
                  GVar9 = LERP_HSV;
                  if (iVar10 == 0) goto LAB_00167ed1;
                  pbVar15 = toml::Value::as<std::__cxx11::string>(pVVar14);
                  iVar10 = std::__cxx11::string::compare((char *)pbVar15);
                  GVar9 = LERP_RGB;
                  if (iVar10 == 0) goto LAB_00167ed1;
                  __return_storage_ptr__->ok = false;
                  std::__cxx11::string::assign((char *)this);
                  std::__cxx11::string::~string((string *)&path);
LAB_00168829:
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                  ::~_Rb_tree(&trs._M_t);
                  goto LAB_00167cf2;
                }
LAB_00167ed1:
                h.lerptype = GVar9;
                grad.points.super__Vector_base<GradientPoint,_std::allocator<GradientPoint>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                grad.points.super__Vector_base<GradientPoint,_std::allocator<GradientPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                grad.points.super__Vector_base<GradientPoint,_std::allocator<GradientPoint>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::__cxx11::string::string((string *)&vs,"points",(allocator *)&channel);
                __x = toml::Value::get<std::vector<toml::Value,std::allocator<toml::Value>>>
                                ((Value *)(p_Var18 + 2),(string *)&vs);
                std::vector<toml::Value,_std::allocator<toml::Value>_>::vector(&points,__x);
                std::__cxx11::string::~string((string *)&vs);
                pVVar8 = points.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                for (this_10 = points.super__Vector_base<toml::Value,_std::allocator<toml::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start; this_10 != pVVar8;
                    this_10 = this_10 + 1) {
                  std::__cxx11::string::string((string *)&vs,"units",(allocator *)&channel);
                  pVVar14 = toml::Value::find(this_10,(string *)&vs);
                  std::__cxx11::string::~string((string *)&vs);
                  local_4e0 = pVVar14;
                  if (pVVar14 == (Value *)0x0) {
                    std::__cxx11::string::string((string *)&vs,"u",(allocator *)&channel);
                    local_4e0 = toml::Value::find(this_10,(string *)&vs);
                    std::__cxx11::string::~string((string *)&vs);
                  }
                  std::__cxx11::string::string((string *)&vs,"color",(allocator *)&channel);
                  pVVar14 = toml::Value::find(this_10,(string *)&vs);
                  std::__cxx11::string::~string((string *)&vs);
                  if (pVVar14 == (Value *)0x0) {
                    std::__cxx11::string::string((string *)&vs,"c",(allocator *)&channel);
                    pVVar14 = toml::Value::find(this_10,(string *)&vs);
                    std::__cxx11::string::~string((string *)&vs);
                  }
                  std::__cxx11::string::string((string *)&vs,"r",(allocator *)&channel);
                  this_02 = toml::Value::find(this_10,(string *)&vs);
                  std::__cxx11::string::~string((string *)&vs);
                  std::__cxx11::string::string((string *)&vs,"g",(allocator *)&channel);
                  this_03 = toml::Value::find(this_10,(string *)&vs);
                  std::__cxx11::string::~string((string *)&vs);
                  std::__cxx11::string::string((string *)&vs,"b",(allocator *)&channel);
                  this_04 = toml::Value::find(this_10,(string *)&vs);
                  std::__cxx11::string::~string((string *)&vs);
                  std::__cxx11::string::string((string *)&vs,"h",(allocator *)&channel);
                  this_05 = toml::Value::find(this_10,(string *)&vs);
                  std::__cxx11::string::~string((string *)&vs);
                  std::__cxx11::string::string((string *)&vs,"s",(allocator *)&channel);
                  this_06 = toml::Value::find(this_10,(string *)&vs);
                  std::__cxx11::string::~string((string *)&vs);
                  std::__cxx11::string::string((string *)&vs,"v",(allocator *)&channel);
                  this_07 = toml::Value::find(this_10,(string *)&vs);
                  std::__cxx11::string::~string((string *)&vs);
                  this_09 = local_4e0;
                  b = -1.0;
                  g = -1.0;
                  r = -1.0;
                  if ((local_4e0 == (Value *)0x0) || ((local_4e0->type_ & ~BOOL_TYPE) != INT_TYPE))
                  {
LAB_0016849e:
                    __return_storage_ptr__->ok = false;
                    std::__cxx11::string::assign((char *)this);
                    goto LAB_001684d7;
                  }
                  if ((pVVar14 == (Value *)0x0) || (pVVar14->type_ != STRING_TYPE)) {
                    if (this_04 != (Value *)0x0 &&
                        (this_03 != (Value *)0x0 && this_02 != (Value *)0x0)) {
                      dVar1 = toml::Value::asNumber(this_02);
                      r = (float)dVar1;
                      dVar1 = toml::Value::asNumber(this_03);
                      g = (float)dVar1;
                      dVar1 = toml::Value::asNumber(this_04);
                      b = (float)dVar1;
                    }
                  }
                  else {
                    pbVar15 = toml::Value::as<std::__cxx11::string>(pVVar14);
                    pcVar19 = (char *)std::__cxx11::string::at((ulong)pbVar15);
                    if (*pcVar19 == '#') {
                      std::__cxx11::stringstream::stringstream((stringstream *)&vs);
                      *(uint *)((long)auStack_3c0 +
                               *(long *)(vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage + -6)) =
                           *(uint *)((long)auStack_3c0 +
                                    *(long *)(vs.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage + -6
                                             )) & 0xffffffb5 | 8;
                      std::__cxx11::string::substr((ulong)&channel,(ulong)pbVar15);
                      std::operator<<((ostream *)
                                      &vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage,(string *)&channel)
                      ;
                      std::__cxx11::string::~string((string *)&channel);
                      std::istream::_M_extract<unsigned_int>((uint *)&vs);
                      if (pbVar15->_M_string_length == 7) {
                        fVar5 = 255.0;
                        local_458.super__Tuple_impl<0UL,_float,_float,_float>.
                        super__Head_base<0UL,_float,_false>._M_head_impl =
                             (float)(ti >> 0x10 & 0xff) / 255.0;
                        _Var4._M_head_impl = (float)(ti >> 8 & 0xff) / 255.0;
                        uVar11 = ti & 0xff;
                      }
                      else {
                        if (pbVar15->_M_string_length != 4) {
                          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::operator+(&channel,"Invalid hex color code: ",pbVar15);
                          std::runtime_error::runtime_error(prVar20,(string *)&channel);
                          __cxa_throw(prVar20,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        fVar5 = 15.0;
                        local_458.super__Tuple_impl<0UL,_float,_float,_float>.
                        super__Head_base<0UL,_float,_false>._M_head_impl =
                             (float)(ti >> 8 & 0xf) / 15.0;
                        _Var4._M_head_impl = (float)(ti >> 4 & 0xf) / 15.0;
                        uVar11 = ti & 0xf;
                      }
                      local_458.super__Tuple_impl<0UL,_float,_float,_float>.
                      super__Tuple_impl<1UL,_float,_float>.super__Head_base<1UL,_float,_false>.
                      _M_head_impl = _Var4._M_head_impl;
                      local_458.super__Tuple_impl<0UL,_float,_float,_float>.
                      super__Tuple_impl<1UL,_float,_float>.super__Tuple_impl<2UL,_float>.
                      super__Head_base<2UL,_float,_false>._M_head_impl =
                           (_Head_base<2UL,_float,_false>)
                           (_Head_base<2UL,_float,_false>)((float)uVar11 / fVar5);
                      std::__cxx11::stringstream::~stringstream((stringstream *)&vs);
                    }
                    else {
                      vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
                      vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x3ff0000000000000;
                      vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
                      std::tuple<float,_float,_float>::tuple<double,_double,_double,_true,_true>
                                (&local_458,(tuple<double,_double,_double> *)&vs);
                    }
                    vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start = (pointer)&b;
                    vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_finish = (pointer)&g;
                    vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_end_of_storage = (pointer)&r;
                    std::tuple<float&,float&,float&>::operator=
                              ((tuple<float&,float&,float&> *)&vs,&local_458);
                    this_09 = local_4e0;
                  }
                  if (((r < 0.0) || (g < 0.0)) || (b < 0.0)) {
                    if (((this_05 == (Value *)0x0) || (this_06 == (Value *)0x0)) ||
                       (this_07 == (Value *)0x0)) goto LAB_0016849e;
                    local_4e0 = (Value *)toml::Value::asNumber(this_09);
                    dVar1 = toml::Value::asNumber(this_05);
                    dVar2 = toml::Value::asNumber(this_06);
                    dVar3 = toml::Value::asNumber(this_07);
                    GradientPoint::fromHSV
                              ((GradientPoint *)&vs,(float)(double)local_4e0,(float)dVar1,
                               (float)dVar2,(float)dVar3);
                    Gradient::addPoint(&grad,(GradientPoint *)&vs);
                  }
                  else {
                    dVar1 = toml::Value::asNumber(this_09);
                    GradientPoint::fromRGB((GradientPoint *)&vs,(float)dVar1,r,g,b);
                    Gradient::addPoint(&grad,(GradientPoint *)&vs);
                  }
                }
                this_08 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
                          ::operator[](&h.gradient,&path);
                std::vector<GradientPoint,_std::allocator<GradientPoint>_>::operator=
                          (&this_08->points,&grad.points);
LAB_001684d7:
                std::vector<toml::Value,_std::allocator<toml::Value>_>::~vector(&points);
                std::_Vector_base<GradientPoint,_std::allocator<GradientPoint>_>::~_Vector_base
                          ((_Vector_base<GradientPoint,_std::allocator<GradientPoint>_> *)&grad);
                std::__cxx11::string::~string((string *)&path);
                if (this_10 != pVVar8) goto LAB_00168829;
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              ::~_Rb_tree(&trs._M_t);
            }
            std::__cxx11::string::string((string *)&vs,"lut",(allocator *)&trs);
            pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
            std::__cxx11::string::~string((string *)&vs);
            if (pVVar14 == (Value *)0x0) {
LAB_00168619:
              std::__cxx11::string::string((string *)&vs,"filename",(allocator *)&trs);
              pVVar14 = toml::Value::find(pVVar13,(string *)&vs);
              std::__cxx11::string::~string((string *)&vs);
              if (pVVar14 != (Value *)0x0) {
                if (pVVar14->type_ == ARRAY_TYPE) {
                  toml::Value::
                  as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((return_type *)&vs,pVVar14);
                  piVar7 = vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  for (piVar21 = vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start; piVar21 != piVar7;
                      piVar21 = piVar21 + 8) {
                    std::__cxx11::string::append((string *)&h.filename);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&vs);
                }
                else {
                  toml::Value::as<std::__cxx11::string>(pVVar14);
                  std::__cxx11::string::_M_assign((string *)&h.filename);
                }
              }
              std::__cxx11::string::string((string *)&vs,"map",(allocator *)&trs);
              pVVar13 = toml::Value::find(pVVar13,(string *)&vs);
              std::__cxx11::string::~string((string *)&vs);
              if (((pVVar13 != (Value *)0x0) && (sVar12 = toml::Value::size(pVVar13), sVar12 != 0))
                 && (sVar12 = toml::Value::size(pVVar13), sVar12 != 0)) {
                toml::Value::find(pVVar13,0);
                Map::Map((Map *)&vs);
                prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar20,
                           "The configuration file includes directives to add a map overlay, but goesproc was compiled without the proj library. Make sure to install the proj library before compiling goesproc, and look for a message saying \'Found proj\' when running cmake. Install proj on Debian/Ubuntu/Raspbian by running: \'sudo apt-get install -y libproj-dev\'."
                          );
                __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              if ((h._344_8_ == 0) ||
                 ((long)h.channels.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)h.channels.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0x40)) {
                if (h.products.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    h.products.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const(&)[5]>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &h.products,(char (*) [5])"cmip");
                }
                bVar6 = false;
                std::vector<Config::Handler,_std::allocator<Config::Handler>_>::push_back
                          (&__return_storage_ptr__->handlers,&h);
              }
              else {
                __return_storage_ptr__->ok = false;
                std::__cxx11::string::assign((char *)this);
                bVar6 = true;
              }
              goto LAB_00167cf5;
            }
            std::__cxx11::string::string((string *)&vs,"path",(allocator *)&channel);
            pbVar15 = toml::Value::get<std::__cxx11::string>(pVVar14,(string *)&vs);
            std::__cxx11::string::string((string *)&trs,(string *)pbVar15);
            std::__cxx11::string::~string((string *)&vs);
            cv::imread((string *)&vs,(int)(string *)&trs);
            if (vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage == (pointer)0x0) {
              __return_storage_ptr__->ok = false;
              std::operator+(&channel,"Unable to load image at: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &trs);
              std::__cxx11::string::operator=((string *)this,(string *)&channel);
              std::__cxx11::string::~string((string *)&channel);
            }
            else {
              lVar17 = cv::Mat::total();
              if (lVar17 == 0x10000) {
                cv::Mat::operator=(&h.lut,(Mat *)&vs);
                cv::Mat::~Mat((Mat *)&vs);
                std::__cxx11::string::~string((string *)&trs);
                goto LAB_00168619;
              }
              __return_storage_ptr__->ok = false;
              std::__cxx11::string::assign((char *)this);
            }
            cv::Mat::~Mat((Mat *)&vs);
            std::__cxx11::string::~string((string *)&trs);
          }
          else {
            toml::Value::as<std::vector<int,std::allocator<int>>>(&vs,pVVar14);
            if ((long)vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x10) {
              h.crop.minColumn =
                   *vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start;
              h.crop.maxColumn =
                   vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[1];
              h.crop.minLine =
                   vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[2];
              h.crop.maxLine =
                   vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[3];
              if ((h.crop.minColumn < h.crop.maxColumn) && (h.crop.minLine < h.crop.maxLine)) {
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&vs.super__Vector_base<int,_std::allocator<int>_>);
                goto LAB_00167b94;
              }
            }
            __return_storage_ptr__->ok = false;
            std::__cxx11::string::assign((char *)this);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&vs.super__Vector_base<int,_std::allocator<int>_>);
          }
LAB_00167cf2:
          bVar6 = true;
        }
        else {
          if (h.origin._M_string_length == 0) {
            toml::Value::as<std::__cxx11::string>(pVVar14);
            std::__cxx11::string::_M_assign((string *)&h.origin);
            goto LAB_0016785a;
          }
          __return_storage_ptr__->ok = false;
          std::__cxx11::string::assign((char *)this);
          bVar6 = true;
        }
LAB_00167cf5:
        Handler::~Handler(&h);
        index = index + 1;
      } while (!bVar6);
    }
  }
  toml::ParseResult::~ParseResult(&pr);
  return __return_storage_ptr__;
}

Assistant:

Config Config::load(const std::string& file) {
  Config out;

  auto pr = toml::parseFile(file);
  if (!pr.valid()) {
    out.ok = false;
    out.error = pr.errorReason;
    return out;
  }

  try {
    loadHandlers(pr.value, out);
  } catch (std::runtime_error& e) {
    out.ok = false;
    out.error = e.what();
  }

  return out;
}